

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O1

size_t __thiscall
google::protobuf::UnknownFieldSet::SpaceUsedExcludingSelfLong(UnknownFieldSet *this)

{
  ulong uVar1;
  anon_union_16_2_b9f6da03_for_SooRep_0 aVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  UnknownField *field;
  char *pcVar8;
  
  iVar3 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  sVar7 = 0;
  if (iVar3 != 0) {
    aVar2 = (this->fields_).soo_rep_.field_0;
    iVar3 = 0;
    if ((undefined1  [16])((undefined1  [16])aVar2 & (undefined1  [16])0x4) != (undefined1  [16])0x0
       ) {
      iVar3 = (this->fields_).soo_rep_.field_0.long_rep.capacity;
    }
    if (0 < iVar3) {
      sVar7 = (long)iVar3 * 0x10 + 0x10;
    }
    if ((undefined1  [16])((undefined1  [16])aVar2 & (undefined1  [16])0x4) == (undefined1  [16])0x0
       ) {
      pcVar8 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
    }
    else {
      pcVar8 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    uVar1 = (this->fields_).soo_rep_.field_0.long_rep.elements_int;
    if ((uVar1 & 4) == 0) {
      pcVar5 = (char *)((long)&(this->fields_).soo_rep_.field_0 + 8);
    }
    else {
      pcVar5 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar3 = internal::SooRep::size((SooRep *)this,(uVar1 & 4) == 0);
    for (; pcVar8 != pcVar5 + (long)iVar3 * 0x10; pcVar8 = pcVar8 + 0x10) {
      if (*(int *)(pcVar8 + 4) == 4) {
        iVar4 = SpaceUsedExcludingSelf(*(UnknownFieldSet **)(pcVar8 + 8));
        sVar7 = sVar7 + (long)iVar4 + 0x10;
      }
      else if (*(int *)(pcVar8 + 4) == 3) {
        sVar6 = internal::StringSpaceUsedExcludingSelfLong(*(string **)(pcVar8 + 8));
        sVar7 = sVar7 + sVar6 + 0x20;
      }
    }
  }
  return sVar7;
}

Assistant:

size_t UnknownFieldSet::SpaceUsedExcludingSelfLong() const {
  if (fields_.empty()) return 0;

  size_t total_size = fields_.SpaceUsedExcludingSelfLong();

  for (const UnknownField& field : fields_) {
    switch (field.type()) {
      case UnknownField::TYPE_LENGTH_DELIMITED:
        total_size += sizeof(*field.data_.string_value) +
                      internal::StringSpaceUsedExcludingSelfLong(
                          *field.data_.string_value);
        break;
      case UnknownField::TYPE_GROUP:
        total_size += field.data_.group->SpaceUsedLong();
        break;
      default:
        break;
    }
  }
  return total_size;
}